

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonschema_draft6_tests.cpp
# Opt level: O2

json __thiscall anon_unknown.dwarf_3128586::resolver(anon_unknown_dwarf_3128586 *this,uri *uri)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *other;
  undefined8 extraout_RDX;
  json jVar1;
  string pathname;
  fstream is;
  byte abStack_348 [496];
  basic_json_options<char> local_158;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathname,"./jsonschema/JSON-Schema-Test-Suite/remotes",
             (allocator<char> *)&is);
  jsoncons::uri::path_abi_cxx11_((string *)&is,uri);
  std::__cxx11::string::append((string *)&pathname);
  std::__cxx11::string::~string((string *)&is);
  std::fstream::fstream(&is,pathname._M_dataplus._M_p,_S_out|_S_in);
  if ((abStack_348[*(long *)(_is + -0x18)] & 5) == 0) {
    memset(&local_158,0,0x148);
    jsoncons::basic_json_options<char>::basic_json_options(&local_158);
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (basic_istream<char,_std::char_traits<char>_> *)&is,
               &local_158.super_basic_json_decode_options<char>);
    jsoncons::basic_json_options<char>::~basic_json_options(&local_158);
  }
  else {
    other = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,other);
  }
  std::fstream::~fstream(&is);
  std::__cxx11::string::~string((string *)&pathname);
  jVar1.field_0.int64_.val_ = extraout_RDX;
  jVar1.field_0._0_8_ = this;
  return (json)jVar1.field_0;
}

Assistant:

json resolver(const jsoncons::uri& uri)
    {
        //std::cout << uri.string() << ", " << uri.path() << "\n";
        std::string pathname = "./jsonschema/JSON-Schema-Test-Suite/remotes";
        pathname += std::string(uri.path());

        std::fstream is(pathname.c_str());
        if (!is)
        {
            return json::null();
        }

        return json::parse(is);
    }